

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawListSplitter::SetCurrentChannel(ImDrawListSplitter *this,ImDrawList *draw_list,int idx)

{
  ImDrawCmdHeader *__s2;
  ImDrawChannel *pIVar1;
  ImVector<unsigned_short> *pIVar2;
  ImDrawCmd *pIVar3;
  unsigned_short *puVar4;
  undefined8 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  long lVar11;
  ImDrawCmd *__s1;
  
  if ((idx < 0) || (this->_Count <= idx)) {
    __assert_fail("idx >= 0 && idx < _Count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_draw.cpp"
                  ,0x701,"void ImDrawListSplitter::SetCurrentChannel(ImDrawList *, int)");
  }
  if (this->_Current == idx) {
    return;
  }
  iVar10 = (draw_list->CmdBuffer).Capacity;
  pIVar3 = (draw_list->CmdBuffer).Data;
  pIVar1 = (this->_Channels).Data + this->_Current;
  (pIVar1->_CmdBuffer).Size = (draw_list->CmdBuffer).Size;
  (pIVar1->_CmdBuffer).Capacity = iVar10;
  (pIVar1->_CmdBuffer).Data = pIVar3;
  iVar10 = (draw_list->IdxBuffer).Capacity;
  puVar4 = (draw_list->IdxBuffer).Data;
  pIVar2 = &(this->_Channels).Data[this->_Current]._IdxBuffer;
  pIVar2->Size = (draw_list->IdxBuffer).Size;
  pIVar2->Capacity = iVar10;
  pIVar2->Data = puVar4;
  this->_Current = idx;
  pIVar1 = (this->_Channels).Data + (uint)idx;
  iVar10 = (pIVar1->_CmdBuffer).Capacity;
  pIVar3 = (pIVar1->_CmdBuffer).Data;
  (draw_list->CmdBuffer).Size = (pIVar1->_CmdBuffer).Size;
  (draw_list->CmdBuffer).Capacity = iVar10;
  (draw_list->CmdBuffer).Data = pIVar3;
  pIVar2 = &(this->_Channels).Data[(uint)idx]._IdxBuffer;
  iVar10 = pIVar2->Capacity;
  puVar4 = pIVar2->Data;
  (draw_list->IdxBuffer).Size = pIVar2->Size;
  (draw_list->IdxBuffer).Capacity = iVar10;
  (draw_list->IdxBuffer).Data = puVar4;
  draw_list->_IdxWritePtr = (draw_list->IdxBuffer).Data + (draw_list->IdxBuffer).Size;
  lVar11 = (long)(draw_list->CmdBuffer).Size;
  if (lVar11 != 0) {
    pIVar3 = (draw_list->CmdBuffer).Data;
    __s1 = pIVar3 + lVar11 + -1;
    if (__s1 != (ImDrawCmd *)0x0) {
      __s2 = &draw_list->_CmdHeader;
      if (pIVar3[lVar11 + -1].ElemCount == 0) {
        fVar6 = (__s2->ClipRect).x;
        fVar7 = (__s2->ClipRect).y;
        fVar8 = (draw_list->_CmdHeader).ClipRect.z;
        fVar9 = (draw_list->_CmdHeader).ClipRect.w;
        uVar5 = *(undefined8 *)((long)&(draw_list->_CmdHeader).TextureId + 4);
        *(undefined8 *)&pIVar3[lVar11 + -1].ClipRect.w =
             *(undefined8 *)&(draw_list->_CmdHeader).ClipRect.w;
        *(undefined8 *)((long)&pIVar3[lVar11 + -1].TextureId + 4) = uVar5;
        (__s1->ClipRect).x = fVar6;
        (__s1->ClipRect).y = fVar7;
        pIVar3[lVar11 + -1].ClipRect.z = fVar8;
        pIVar3[lVar11 + -1].ClipRect.w = fVar9;
      }
      else {
        iVar10 = bcmp(__s1,__s2,0x1c);
        if (iVar10 != 0) goto LAB_0015b42a;
      }
      return;
    }
  }
LAB_0015b42a:
  ImDrawList::AddDrawCmd(draw_list);
  return;
}

Assistant:

void ImDrawListSplitter::SetCurrentChannel(ImDrawList* draw_list, int idx)
{
    IM_ASSERT(idx >= 0 && idx < _Count);
    if (_Current == idx)
        return;

    // Overwrite ImVector (12/16 bytes), four times. This is merely a silly optimization instead of doing .swap()
    memcpy(&_Channels.Data[_Current]._CmdBuffer, &draw_list->CmdBuffer, sizeof(draw_list->CmdBuffer));
    memcpy(&_Channels.Data[_Current]._IdxBuffer, &draw_list->IdxBuffer, sizeof(draw_list->IdxBuffer));
    _Current = idx;
    memcpy(&draw_list->CmdBuffer, &_Channels.Data[idx]._CmdBuffer, sizeof(draw_list->CmdBuffer));
    memcpy(&draw_list->IdxBuffer, &_Channels.Data[idx]._IdxBuffer, sizeof(draw_list->IdxBuffer));
    draw_list->_IdxWritePtr = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size;

    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = (draw_list->CmdBuffer.Size == 0) ? NULL : &draw_list->CmdBuffer.Data[draw_list->CmdBuffer.Size - 1];
    if (curr_cmd == NULL)
        draw_list->AddDrawCmd();
    else if (curr_cmd->ElemCount == 0)
        ImDrawCmd_HeaderCopy(curr_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
    else if (ImDrawCmd_HeaderCompare(curr_cmd, &draw_list->_CmdHeader) != 0)
        draw_list->AddDrawCmd();
}